

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypes.h
# Opt level: O2

uint3 Diligent::GetNumSparseTilesInBox(Box *Region,Uint32 *TileSize)

{
  uint3 uVar1;
  
  uVar1.field_0._8_4_ = (~Region->MinZ + Region->MaxZ + TileSize[2]) / TileSize[2];
  uVar1.field_0._0_8_ =
       (ulong)(~Region->MinX + Region->MaxX + *TileSize) / (ulong)*TileSize |
       (ulong)(~Region->MinY + Region->MaxY + TileSize[1]) / (ulong)TileSize[1] << 0x20;
  return (uint3)uVar1.field_0;
}

Assistant:

constexpr Uint32 Depth()   const { return MaxZ - MinZ; }